

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

bool check_playing(DESCRIPTOR_DATA *d,char *name)

{
  bool bVar1;
  char *in_RSI;
  DESCRIPTOR_DATA *in_RDI;
  DESCRIPTOR_DATA *dold;
  char *local_30;
  DESCRIPTOR_DATA *pDVar2;
  int length;
  
  pDVar2 = descriptor_list;
  do {
    if (pDVar2 == (DESCRIPTOR_DATA *)0x0) {
      return false;
    }
    if ((((pDVar2 != in_RDI) && (pDVar2->character != (CHAR_DATA *)0x0)) && (pDVar2->connected != 1)
        ) && (pDVar2->connected != 2)) {
      if (pDVar2->original == (CHAR_DATA *)0x0) {
        local_30 = pDVar2->character->true_name;
      }
      else {
        local_30 = pDVar2->original->true_name;
      }
      bVar1 = str_cmp(in_RSI,local_30);
      if (!bVar1) {
        length = (int)((ulong)pDVar2 >> 0x20);
        write_to_buffer(in_RDI,in_RSI,length);
        write_to_buffer(in_RDI,in_RSI,length);
        in_RDI->connected = 0x11;
        return true;
      }
    }
    pDVar2 = pDVar2->next;
  } while( true );
}

Assistant:

bool check_playing(DESCRIPTOR_DATA *d, char *name)
{
	DESCRIPTOR_DATA *dold;

	for (dold = descriptor_list; dold; dold = dold->next)
	{
		if (dold != d
			&& dold->character != nullptr
			&& dold->connected != CON_GET_NAME
			&& dold->connected != CON_GET_OLD_PASSWORD
			&& !str_cmp(name, dold->original ? dold->original->true_name : dold->character->true_name))
		{
			write_to_buffer(d, "That character is already playing.\n\r", 0);
			write_to_buffer(d, "Do you wish to connect anyway (Y/N)?", 0);

			d->connected = CON_BREAK_CONNECT;
			return true;
		}
	}

	return false;
}